

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O2

dictionary_t dictionary_datrie_open(char *filename)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long *t_dictionary;
  FILE *__stream;
  size_t __len;
  char *__s1;
  char *pcVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  ssize_t sVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  t_dictionary = (long *)malloc(0x40);
  *t_dictionary = 0;
  t_dictionary[2] = 0;
  __stream = fopen(filename,"rb");
  iVar3 = fileno(__stream);
  fseek(__stream,0,2);
  __len = ftell(__stream);
  t_dictionary[6] = __len;
  *(undefined4 *)(t_dictionary + 7) = 0;
  __s1 = (char *)mmap((void *)0x0,__len,1,2,iVar3,0);
  pcVar4 = __s1;
  if (__s1 == (char *)0xffffffffffffffff) {
    pcVar4 = (char *)0x0;
  }
  t_dictionary[5] = (long)pcVar4;
  if (__s1 == (char *)0xffffffffffffffff) {
    *(undefined4 *)(t_dictionary + 7) = 1;
    __s1 = (char *)malloc(__len);
    t_dictionary[5] = (long)__s1;
    if (__s1 == (char *)0x0) goto LAB_0010267a;
    lseek(iVar3,0,0);
    sVar9 = read(iVar3,__s1,__len);
    if (sVar9 == -1) goto LAB_0010267a;
  }
  iVar3 = strncmp(__s1,"OPENCCDATRIE",0xc);
  if (iVar3 == 0) {
    uVar1 = *(uint *)(__s1 + 0xc);
    t_dictionary[2] = (long)(__s1 + 0x10);
    uVar5 = (ulong)*(uint *)(__s1 + (ulong)uVar1 * 4 + 0x10);
    pcVar4 = __s1 + uVar5 * 4 + (ulong)uVar1 * 4 + 0x1c;
    uVar2 = *(uint *)(pcVar4 + -8);
    *(uint *)(t_dictionary + 3) = uVar2;
    *(undefined4 *)(t_dictionary + 1) = *(undefined4 *)(pcVar4 + -4);
    *t_dictionary = (long)pcVar4;
    pvVar6 = malloc((ulong)uVar2 * 8);
    t_dictionary[4] = (long)pvVar6;
    uVar15 = 0;
    for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
      uVar7 = uVar15;
      uVar13 = uVar5;
      if (uVar5 < uVar15) {
        uVar13 = uVar15;
      }
      while ((uVar14 = uVar13, uVar13 != uVar7 &&
             (uVar14 = uVar7, *(int *)(__s1 + uVar7 * 4 + (ulong)uVar1 * 4 + 0x14) != -1))) {
        uVar7 = uVar7 + 1;
      }
      lVar12 = uVar14 - uVar15;
      pvVar8 = malloc(lVar12 * 8 + 8);
      *(void **)((long)pvVar6 + uVar11 * 8) = pvVar8;
      for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
        *(char **)(*(long *)((long)pvVar6 + uVar11 * 8) + lVar10 * 8) =
             __s1 + 0x10 +
             (ulong)*(uint *)(__s1 + lVar10 * 4 + uVar15 * 4 + 0x14 + (ulong)uVar1 * 4) * 4;
      }
      *(undefined8 *)(*(long *)((long)pvVar6 + uVar11 * 8) + lVar12 * 8) = 0;
      uVar15 = uVar14 + 1;
    }
    fclose(__stream);
    return t_dictionary;
  }
LAB_0010267a:
  dictionary_datrie_close(t_dictionary);
  return (dictionary_t)0xffffffffffffffff;
}

Assistant:

dictionary_t dictionary_datrie_open(const char * filename)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) malloc(sizeof(datrie_dictionary_desc));
	datrie_dictionary->dat = NULL;
	datrie_dictionary->lexicon = NULL;

	FILE * fp = fopen(filename, "rb");

	if (load_dict(datrie_dictionary, fp) == -1)
	{
		dictionary_datrie_close((dictionary_t) datrie_dictionary);
		return (dictionary_t) -1;
	}

	fclose(fp);

	return (dictionary_t) datrie_dictionary;
}